

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFastHuf.cpp
# Opt level: O1

void __thiscall
Imf_3_4::FastHufDecoder::decode
          (FastHufDecoder *this,uchar *src,int numSrcBits,unsigned_short *dst,int numDstElems)

{
  unsigned_short uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  InputExc *this_00;
  byte bVar21;
  int iVar22;
  ulong uVar23;
  ulong *puVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  int *piVar31;
  ulong uVar32;
  int iVar33;
  uint uVar34;
  long lVar35;
  undefined1 in_XMM0 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar42;
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar57;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  long lVar44;
  
  auVar20 = _DAT_001b43a0;
  auVar19 = _DAT_001b4370;
  auVar18 = _DAT_001b4270;
  auVar17 = _DAT_001b34a0;
  if (numSrcBits < 0x80) {
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc
              (this_00,
               "Error choosing Huffman decoder implementation (insufficient number of bits).");
  }
  else {
    iVar22 = numSrcBits + -0x80;
    if (0 < numDstElems) {
      uVar4 = *(ulong *)src;
      uVar23 = *(ulong *)(src + 8);
      uVar23 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
               (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
               (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 | (uVar23 & 0xff00) << 0x28
               | uVar23 << 0x38;
      uVar32 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
               | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 |
               (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
      puVar24 = (ulong *)(src + 0x10);
      uVar4 = this->_tableMin;
      iVar2 = this->_numSymbols;
      piVar5 = this->_idToSymbol;
      iVar3 = this->_rleSymbol;
      uVar26 = 0x40;
      uVar34 = 0;
      iVar33 = 0x40;
      do {
        if (uVar32 < uVar4) {
          if (uVar26 < 0x40) {
            iVar29 = 0x40 - uVar26;
            uVar32 = uVar23 >> ((byte)uVar26 & 0x3f) | uVar32;
            iVar25 = iVar29 - iVar33;
            if (iVar25 != 0 && iVar33 <= iVar29) {
              if (iVar22 < 0x40) {
                if (iVar22 < 1) {
                  uVar23 = 0;
                }
                else {
                  bVar21 = 0x38;
                  uVar23 = 0;
                  iVar33 = iVar22;
                  do {
                    uVar23 = uVar23 | (ulong)(byte)*puVar24 << (bVar21 & 0x3f);
                    puVar24 = (ulong *)((long)puVar24 + 1);
                    bVar21 = bVar21 - 8;
                    iVar22 = iVar33 + -8;
                    bVar6 = 8 < iVar33;
                    iVar33 = iVar22;
                  } while (bVar6);
                }
                if (iVar22 < 1) {
                  iVar22 = 0;
                }
              }
              else {
                uVar23 = *puVar24;
                uVar23 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                         (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                         (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                         (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
                puVar24 = puVar24 + 1;
                iVar22 = iVar22 + -0x40;
              }
              uVar32 = uVar32 | uVar23 >> (-(char)iVar25 & 0x3fU);
              iVar33 = 0x40;
              iVar29 = iVar25;
            }
            uVar23 = uVar23 << ((byte)iVar29 & 0x3f);
            if (iVar33 - iVar29 == 0 || iVar33 < iVar29) {
              uVar23 = 0;
            }
            uVar26 = 0x40;
            iVar33 = iVar33 - iVar29;
          }
          lVar35 = -0x34;
          do {
            lVar44 = lVar35;
            if (this->_ljOffset[lVar44 + 6] <= uVar32) break;
            lVar35 = lVar44 + 1;
          } while (lVar44 + 0x41U <= (ulong)this->_maxCodeLength);
          if ((ulong)this->_maxCodeLength < lVar44 + 0x41U) {
            this_00 = (InputExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::InputExc::InputExc(this_00,"Huffman decode error (Decoded an invalid symbol).")
            ;
            goto LAB_0017867c;
          }
          uVar30 = (uVar32 >> (-(char)(lVar44 + 1) & 0x3fU)) +
                   *(long *)(this->_tableSymbol + lVar44 * 2 + 0xc);
          if ((ulong)(long)iVar2 <= uVar30) {
            this_00 = (InputExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::InputExc::InputExc(this_00,"Huffman decode error (Decoded an invalid symbol).")
            ;
            goto LAB_0017867c;
          }
          uVar28 = (int)lVar44 + 0x41;
          piVar31 = piVar5 + uVar30;
        }
        else {
          uVar28 = (uint)this->_tableCodeLen[uVar32 >> 0x34];
          piVar31 = this->_tableSymbol + (uVar32 >> 0x34);
        }
        uVar32 = uVar32 << ((byte)uVar28 & 0x3f);
        uVar26 = uVar26 - uVar28;
        if (*piVar31 == iVar3) {
          if ((int)uVar26 < 8) {
            iVar25 = 0x40 - uVar26;
            uVar32 = uVar23 >> ((byte)uVar26 & 0x3f) | uVar32;
            iVar27 = iVar25 - iVar33;
            iVar29 = iVar33;
            if (iVar27 != 0 && iVar33 <= iVar25) {
              if (iVar22 < 0x40) {
                if (iVar22 < 1) {
                  uVar23 = 0;
                }
                else {
                  bVar21 = 0x38;
                  uVar23 = 0;
                  iVar33 = iVar22;
                  do {
                    uVar23 = uVar23 | (ulong)(byte)*puVar24 << (bVar21 & 0x3f);
                    puVar24 = (ulong *)((long)puVar24 + 1);
                    bVar21 = bVar21 - 8;
                    iVar22 = iVar33 + -8;
                    bVar6 = 8 < iVar33;
                    iVar33 = iVar22;
                  } while (bVar6);
                }
                if (iVar22 < 1) {
                  iVar22 = 0;
                }
              }
              else {
                uVar23 = *puVar24;
                uVar23 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                         (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                         (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                         (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
                puVar24 = puVar24 + 1;
                iVar22 = iVar22 + -0x40;
              }
              uVar32 = uVar32 | uVar23 >> (-(char)iVar27 & 0x3fU);
              iVar29 = 0x40;
              iVar25 = iVar27;
            }
            uVar23 = uVar23 << ((byte)iVar25 & 0x3f);
            iVar33 = iVar29 - iVar25;
            if (iVar33 == 0 || iVar29 < iVar25) {
              uVar23 = 0;
            }
            uVar26 = 0x40;
          }
          if ((int)uVar34 < 1) {
            this_00 = (InputExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::InputExc::InputExc
                      (this_00,"Huffman decode error (RLE code with no previous symbol).");
            goto LAB_0017867c;
          }
          bVar21 = (byte)(uVar32 >> 0x38);
          uVar28 = uVar34 + bVar21;
          if (numDstElems < (int)uVar28) {
            this_00 = (InputExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::InputExc::InputExc
                      (this_00,
                       "Huffman decode error (Symbol run beyond expected output buffer length).");
            goto LAB_0017867c;
          }
          if (uVar32 >> 0x38 == 0) {
            this_00 = (InputExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::InputExc::InputExc(this_00,"Huffman decode error (Invalid RLE length)");
            goto LAB_0017867c;
          }
          lVar35 = (uVar32 >> 0x38) - 1;
          auVar41._8_4_ = (int)lVar35;
          auVar41._0_8_ = lVar35;
          auVar41._12_4_ = (int)((ulong)lVar35 >> 0x20);
          lVar35 = (ulong)uVar34 * 2;
          auVar41 = auVar41 ^ auVar17;
          uVar30 = 0;
          auVar43 = auVar18;
          auVar45 = auVar19;
          auVar46 = auVar20;
          auVar47 = _DAT_001b4390;
          do {
            auVar48 = auVar43 ^ auVar17;
            iVar29 = auVar41._0_4_;
            iVar54 = -(uint)(iVar29 < auVar48._0_4_);
            iVar25 = auVar41._4_4_;
            auVar49._4_4_ = -(uint)(iVar25 < auVar48._4_4_);
            iVar27 = auVar41._8_4_;
            iVar57 = -(uint)(iVar27 < auVar48._8_4_);
            iVar42 = auVar41._12_4_;
            auVar49._12_4_ = -(uint)(iVar42 < auVar48._12_4_);
            auVar36._4_4_ = iVar54;
            auVar36._0_4_ = iVar54;
            auVar36._8_4_ = iVar57;
            auVar36._12_4_ = iVar57;
            auVar58 = pshuflw(in_XMM15,auVar36,0xe8);
            auVar37._4_4_ = -(uint)(auVar48._4_4_ == iVar25);
            auVar37._12_4_ = -(uint)(auVar48._12_4_ == iVar42);
            auVar37._0_4_ = auVar37._4_4_;
            auVar37._8_4_ = auVar37._12_4_;
            auVar36 = pshuflw(in_XMM0,auVar37,0xe8);
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            auVar59 = pshuflw(auVar58,auVar49,0xe8);
            auVar48._8_4_ = 0xffffffff;
            auVar48._0_8_ = 0xffffffffffffffff;
            auVar48._12_4_ = 0xffffffff;
            auVar48 = (auVar59 | auVar36 & auVar58) ^ auVar48;
            auVar48 = packssdw(auVar48,auVar48);
            uVar1 = dst[(ulong)uVar34 - 1];
            if ((auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)dst + uVar30 + lVar35) = uVar1;
            }
            auVar59._4_4_ = iVar54;
            auVar59._0_4_ = iVar54;
            auVar59._8_4_ = iVar57;
            auVar59._12_4_ = iVar57;
            auVar49 = auVar37 & auVar59 | auVar49;
            auVar36 = packssdw(auVar49,auVar49);
            auVar58._8_4_ = 0xffffffff;
            auVar58._0_8_ = 0xffffffffffffffff;
            auVar58._12_4_ = 0xffffffff;
            auVar36 = packssdw(auVar36 ^ auVar58,auVar36 ^ auVar58);
            if ((auVar36._0_4_ >> 0x10 & 1) != 0) {
              *(unsigned_short *)((long)dst + uVar30 + lVar35 + 2) = uVar1;
            }
            auVar36 = auVar45 ^ auVar17;
            iVar54 = -(uint)(iVar29 < auVar36._0_4_);
            auVar55._4_4_ = -(uint)(iVar25 < auVar36._4_4_);
            iVar57 = -(uint)(iVar27 < auVar36._8_4_);
            auVar55._12_4_ = -(uint)(iVar42 < auVar36._12_4_);
            auVar50._4_4_ = iVar54;
            auVar50._0_4_ = iVar54;
            auVar50._8_4_ = iVar57;
            auVar50._12_4_ = iVar57;
            iVar54 = -(uint)(auVar36._4_4_ == iVar25);
            iVar57 = -(uint)(auVar36._12_4_ == iVar42);
            auVar11._4_4_ = iVar54;
            auVar11._0_4_ = iVar54;
            auVar11._8_4_ = iVar57;
            auVar11._12_4_ = iVar57;
            auVar55._0_4_ = auVar55._4_4_;
            auVar55._8_4_ = auVar55._12_4_;
            auVar36 = auVar11 & auVar50 | auVar55;
            auVar36 = packssdw(auVar36,auVar36);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            auVar36 = packssdw(auVar36 ^ auVar7,auVar36 ^ auVar7);
            if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)dst + uVar30 + lVar35 + 4) = uVar1;
            }
            auVar36 = pshufhw(auVar36,auVar50,0x84);
            auVar12._4_4_ = iVar54;
            auVar12._0_4_ = iVar54;
            auVar12._8_4_ = iVar57;
            auVar12._12_4_ = iVar57;
            auVar49 = pshufhw(auVar50,auVar12,0x84);
            auVar37 = pshufhw(auVar36,auVar55,0x84);
            auVar38._8_4_ = 0xffffffff;
            auVar38._0_8_ = 0xffffffffffffffff;
            auVar38._12_4_ = 0xffffffff;
            auVar38 = (auVar37 | auVar49 & auVar36) ^ auVar38;
            auVar36 = packssdw(auVar38,auVar38);
            if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)dst + uVar30 + lVar35 + 6) = uVar1;
            }
            auVar36 = auVar46 ^ auVar17;
            iVar54 = -(uint)(iVar29 < auVar36._0_4_);
            auVar52._4_4_ = -(uint)(iVar25 < auVar36._4_4_);
            iVar57 = -(uint)(iVar27 < auVar36._8_4_);
            auVar52._12_4_ = -(uint)(iVar42 < auVar36._12_4_);
            auVar13._4_4_ = iVar54;
            auVar13._0_4_ = iVar54;
            auVar13._8_4_ = iVar57;
            auVar13._12_4_ = iVar57;
            auVar37 = pshuflw(auVar48,auVar13,0xe8);
            auVar39._0_4_ = -(uint)(auVar36._0_4_ == iVar29);
            auVar39._4_4_ = -(uint)(auVar36._4_4_ == iVar25);
            auVar39._8_4_ = -(uint)(auVar36._8_4_ == iVar27);
            auVar39._12_4_ = -(uint)(auVar36._12_4_ == iVar42);
            auVar51._4_4_ = auVar39._4_4_;
            auVar51._0_4_ = auVar39._4_4_;
            auVar51._8_4_ = auVar39._12_4_;
            auVar51._12_4_ = auVar39._12_4_;
            auVar48 = pshuflw(auVar39,auVar51,0xe8);
            auVar52._0_4_ = auVar52._4_4_;
            auVar52._8_4_ = auVar52._12_4_;
            auVar36 = pshuflw(auVar37,auVar52,0xe8);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            in_XMM15 = (auVar36 | auVar48 & auVar37) ^ auVar8;
            auVar48 = packssdw(auVar48 & auVar37,in_XMM15);
            if ((auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)dst + uVar30 + lVar35 + 8) = uVar1;
            }
            auVar14._4_4_ = iVar54;
            auVar14._0_4_ = iVar54;
            auVar14._8_4_ = iVar57;
            auVar14._12_4_ = iVar57;
            auVar52 = auVar51 & auVar14 | auVar52;
            auVar36 = packssdw(auVar52,auVar52);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar48 = packssdw(auVar48,auVar36 ^ auVar9);
            if ((auVar48 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)dst + uVar30 + lVar35 + 10) = uVar1;
            }
            auVar48 = auVar47 ^ auVar17;
            iVar29 = -(uint)(iVar29 < auVar48._0_4_);
            auVar56._4_4_ = -(uint)(iVar25 < auVar48._4_4_);
            iVar27 = -(uint)(iVar27 < auVar48._8_4_);
            auVar56._12_4_ = -(uint)(iVar42 < auVar48._12_4_);
            auVar53._4_4_ = iVar29;
            auVar53._0_4_ = iVar29;
            auVar53._8_4_ = iVar27;
            auVar53._12_4_ = iVar27;
            iVar29 = -(uint)(auVar48._4_4_ == iVar25);
            iVar25 = -(uint)(auVar48._12_4_ == iVar42);
            auVar15._4_4_ = iVar29;
            auVar15._0_4_ = iVar29;
            auVar15._8_4_ = iVar25;
            auVar15._12_4_ = iVar25;
            auVar56._0_4_ = auVar56._4_4_;
            auVar56._8_4_ = auVar56._12_4_;
            auVar48 = auVar15 & auVar53 | auVar56;
            auVar48 = packssdw(auVar48,auVar48);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar48 = packssdw(auVar48 ^ auVar10,auVar48 ^ auVar10);
            if ((auVar48 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)dst + uVar30 + lVar35 + 0xc) = uVar1;
            }
            auVar48 = pshufhw(auVar48,auVar53,0x84);
            auVar16._4_4_ = iVar29;
            auVar16._0_4_ = iVar29;
            auVar16._8_4_ = iVar25;
            auVar16._12_4_ = iVar25;
            auVar37 = pshufhw(auVar53,auVar16,0x84);
            auVar36 = pshufhw(auVar48,auVar56,0x84);
            auVar40._8_4_ = 0xffffffff;
            auVar40._0_8_ = 0xffffffffffffffff;
            auVar40._12_4_ = 0xffffffff;
            auVar40 = (auVar36 | auVar37 & auVar48) ^ auVar40;
            in_XMM0 = packssdw(auVar40,auVar40);
            if ((in_XMM0 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(unsigned_short *)((long)dst + uVar30 + lVar35 + 0xe) = uVar1;
            }
            lVar44 = auVar43._8_8_;
            auVar43._0_8_ = auVar43._0_8_ + 8;
            auVar43._8_8_ = lVar44 + 8;
            lVar44 = auVar45._8_8_;
            auVar45._0_8_ = auVar45._0_8_ + 8;
            auVar45._8_8_ = lVar44 + 8;
            lVar44 = auVar46._8_8_;
            auVar46._0_8_ = auVar46._0_8_ + 8;
            auVar46._8_8_ = lVar44 + 8;
            lVar44 = auVar47._8_8_;
            auVar47._0_8_ = auVar47._0_8_ + 8;
            auVar47._8_8_ = lVar44 + 8;
            uVar30 = uVar30 + 0x10;
          } while (((uint)bVar21 * 2 + 0xe & 0xfffffff0) != uVar30);
          uVar32 = uVar32 << 8;
          uVar26 = uVar26 - 8;
          uVar34 = uVar28;
        }
        else {
          dst[(int)uVar34] = (unsigned_short)*piVar31;
          uVar34 = uVar34 + 1;
        }
        if ((int)uVar26 < 0xc) {
          iVar29 = 0x40 - uVar26;
          uVar32 = uVar23 >> ((byte)uVar26 & 0x3f) | uVar32;
          iVar25 = iVar29 - iVar33;
          if (iVar25 != 0 && iVar33 <= iVar29) {
            if (iVar22 < 0x40) {
              if (iVar22 < 1) {
                uVar23 = 0;
              }
              else {
                bVar21 = 0x38;
                uVar23 = 0;
                iVar33 = iVar22;
                do {
                  uVar23 = uVar23 | (ulong)(byte)*puVar24 << (bVar21 & 0x3f);
                  puVar24 = (ulong *)((long)puVar24 + 1);
                  bVar21 = bVar21 - 8;
                  iVar22 = iVar33 + -8;
                  bVar6 = 8 < iVar33;
                  iVar33 = iVar22;
                } while (bVar6);
              }
              if (iVar22 < 1) {
                iVar22 = 0;
              }
            }
            else {
              uVar23 = *puVar24;
              uVar23 = uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 |
                       (uVar23 & 0xff0000000000) >> 0x18 | (uVar23 & 0xff00000000) >> 8 |
                       (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
                       (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38;
              puVar24 = puVar24 + 1;
              iVar22 = iVar22 + -0x40;
            }
            uVar32 = uVar32 | uVar23 >> (-(char)iVar25 & 0x3fU);
            iVar33 = 0x40;
            iVar29 = iVar25;
          }
          uVar23 = uVar23 << ((byte)iVar29 & 0x3f);
          if (iVar33 - iVar29 == 0 || iVar33 < iVar29) {
            uVar23 = 0;
          }
          uVar26 = 0x40;
          iVar33 = iVar33 - iVar29;
        }
      } while ((int)uVar34 < numDstElems);
    }
    if (iVar22 == 0) {
      return;
    }
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc
              (this_00,
               "Huffman decode error (Compressed data remains after filling expected output buffer)."
              );
  }
LAB_0017867c:
  __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

void
FastHufDecoder::decode (
    const unsigned char* src,
    int                  numSrcBits,
    unsigned short*      dst,
    int                  numDstElems)
{
    if (numSrcBits < 128)
        throw IEX_NAMESPACE::InputExc (
            "Error choosing Huffman decoder implementation "
            "(insufficient number of bits).");

    //
    // Current position (byte/bit) in the src data stream
    // (after the first buffer fill)
    //

    const unsigned char* currByte = src + 2 * sizeof (uint64_t);

    numSrcBits -= 8 * 2 * sizeof (uint64_t);

    //
    // 64-bit buffer holding the current bits in the stream
    //

    uint64_t buffer        = READ64 (src);
    int      bufferNumBits = 64;

    //
    // 64-bit buffer holding the next bits in the stream
    //

    uint64_t bufferBack        = READ64 ((src + sizeof (uint64_t)));
    int      bufferBackNumBits = 64;

    int dstIdx = 0;

    while (dstIdx < numDstElems)
    {
        int codeLen;
        int symbol;

        //
        // Test if we can be table accelerated. If so, directly
        // lookup the output symbol. Otherwise, we need to fall
        // back to searching for the code.
        //
        // If we're doing table lookups, we don't really need
        // a re-filled buffer, so long as we have TABLE_LOOKUP_BITS
        // left. But for a search, we do need a refilled table.
        //

        if (_tableMin <= buffer)
        {
            int tableIdx = buffer >> (64 - TABLE_LOOKUP_BITS);

            //
            // For invalid codes, _tableCodeLen[] should return 0. This
            // will cause the decoder to get stuck in the current spot
            // until we run out of elements, then barf that the codestream
            // is bad.  So we don't need to stick a condition like
            //     if (codeLen > _maxCodeLength) in this inner.
            //

            codeLen = _tableCodeLen[tableIdx];
            symbol  = _tableSymbol[tableIdx];
        }
        else
        {
            if (bufferNumBits < 64)
            {
                refill (
                    buffer,
                    64 - bufferNumBits,
                    bufferBack,
                    bufferBackNumBits,
                    currByte,
                    numSrcBits);

                bufferNumBits = 64;
            }

            //
            // Brute force search:
            // Find the smallest length where _ljBase[length] <= buffer
            //

            codeLen = TABLE_LOOKUP_BITS + 1;

            while (_ljBase[codeLen] > buffer && codeLen <= _maxCodeLength)
                codeLen++;

            if (codeLen > _maxCodeLength)
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error "
                                               "(Decoded an invalid symbol).");
            }

            uint64_t id = _ljOffset[codeLen] + (buffer >> (64 - codeLen));
            if (id < static_cast<uint64_t> (_numSymbols))
            {
                symbol = _idToSymbol[id];
            }
            else
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error "
                                               "(Decoded an invalid symbol).");
            }
        }

        //
        // Shift over bit stream, and update the bit count in the buffer
        //

        buffer = buffer << codeLen;
        bufferNumBits -= codeLen;

        //
        // If we received a RLE symbol (_rleSymbol), then we need
        // to read ahead 8 bits to know how many times to repeat
        // the previous symbol. Need to ensure we at least have
        // 8 bits of data in the buffer
        //

        if (symbol == _rleSymbol)
        {
            if (bufferNumBits < 8)
            {
                refill (
                    buffer,
                    64 - bufferNumBits,
                    bufferBack,
                    bufferBackNumBits,
                    currByte,
                    numSrcBits);

                bufferNumBits = 64;
            }

            int rleCount = buffer >> 56;

            if (dstIdx < 1)
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error (RLE code "
                                               "with no previous symbol).");
            }

            if (dstIdx + rleCount > numDstElems)
            {
                throw IEX_NAMESPACE::InputExc (
                    "Huffman decode error (Symbol run "
                    "beyond expected output buffer length).");
            }

            if (rleCount <= 0)
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error"
                                               " (Invalid RLE length)");
            }

            for (int i = 0; i < rleCount; ++i)
                dst[dstIdx + i] = dst[dstIdx - 1];

            dstIdx += rleCount;

            buffer = buffer << 8;
            bufferNumBits -= 8;
        }
        else
        {
            dst[dstIdx] = symbol;
            dstIdx++;
        }

        //
        // refill bit stream buffer if we're below the number of
        // bits needed for a table lookup
        //

        if (bufferNumBits < TABLE_LOOKUP_BITS)
        {
            refill (
                buffer,
                64 - bufferNumBits,
                bufferBack,
                bufferBackNumBits,
                currByte,
                numSrcBits);

            bufferNumBits = 64;
        }
    }

    if (numSrcBits != 0)
    {
        throw IEX_NAMESPACE::InputExc (
            "Huffman decode error (Compressed data remains "
            "after filling expected output buffer).");
    }
}